

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  
  test_2d_static<0ul,0ul,1ul,1ul>();
  test_2d_static<0ul,0ul,30ul,1ul>();
  test_2d_static<0ul,0ul,1ul,30ul>();
  test_2d_static<0ul,0ul,30ul,30ul>();
  test_2d_static<1ul,0ul,30ul,1ul>();
  test_2d_static<0ul,1ul,1ul,30ul>();
  test_2d_static<1ul,1ul,30ul,30ul>();
  test_2d_static<5ul,0ul,30ul,1ul>();
  test_2d_static<0ul,5ul,1ul,30ul>();
  test_2d_static<5ul,5ul,30ul,30ul>();
  test_2d_dynamic<0ul,0ul,1ul,1ul>();
  test_2d_dynamic<0ul,0ul,30ul,1ul>();
  test_2d_dynamic<0ul,0ul,1ul,30ul>();
  test_2d_dynamic<0ul,0ul,30ul,30ul>();
  test_2d_dynamic<1ul,0ul,30ul,1ul>();
  test_2d_dynamic<0ul,1ul,1ul,30ul>();
  test_2d_dynamic<1ul,1ul,30ul,30ul>();
  test_2d_dynamic<5ul,0ul,30ul,1ul>();
  test_2d_dynamic<0ul,5ul,1ul,30ul>();
  test_2d_dynamic<5ul,5ul,30ul,30ul>();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    ///////////////////////////////////////////////////////////////////////////
    // 2D Static

    test_2d_static<0, 0, 1,  1 >();

    test_2d_static<0, 0, 30, 1 >();
    test_2d_static<0, 0, 1,  30>();
    test_2d_static<0, 0, 30, 30>();

    test_2d_static<1, 0, 30, 1 >();
    test_2d_static<0, 1, 1,  30>();
    test_2d_static<1, 1, 30, 30>();

    test_2d_static<5, 0, 30, 1 >();
    test_2d_static<0, 5, 1,  30>();
    test_2d_static<5, 5, 30, 30>();

    ///////////////////////////////////////////////////////////////////////////
    // 2D Dynamic

    test_2d_dynamic<0, 0, 1,  1 >();

    test_2d_dynamic<0, 0, 30, 1 >();
    test_2d_dynamic<0, 0, 1,  30>();
    test_2d_dynamic<0, 0, 30, 30>();

    test_2d_dynamic<1, 0, 30, 1 >();
    test_2d_dynamic<0, 1, 1,  30>();
    test_2d_dynamic<1, 1, 30, 30>();

    test_2d_dynamic<5, 0, 30, 1 >();
    test_2d_dynamic<0, 5, 1,  30>();
    test_2d_dynamic<5, 5, 30, 30>();

    return boost::report_errors();
}